

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnObj.c
# Opt level: O3

char * Wln_ObjConstString(Wln_Ntk_t *p,int iObj)

{
  anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *paVar1;
  char *pcVar2;
  
  if ((-1 < iObj) && (iObj < (p->vTypes).nSize)) {
    if ((p->vTypes).pArray[(uint)iObj] == 0x61) {
      paVar1 = &p->vFanins[(uint)iObj].field_2;
      if (2 < p->vFanins[(uint)iObj].nSize) {
        paVar1 = (anon_union_8_2_7a96f2af_for_Wln_Vec_t__2 *)paVar1->pArray[0];
      }
      pcVar2 = Abc_NamStr(p->pManName,paVar1->Array[0]);
      return pcVar2;
    }
    __assert_fail("Wln_ObjIsConst(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnObj.c"
                  ,0x37,"char *Wln_ObjConstString(Wln_Ntk_t *, int)");
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

char * Wln_ObjConstString( Wln_Ntk_t * p, int iObj )
{
    assert( Wln_ObjIsConst(p, iObj) );
    return Abc_NamStr( p->pManName, Wln_ObjFanin0(p, iObj) );
}